

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O3

UBool MBCSOkForBaseFromUnicode
                (MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  if ((((length != 1 || flag != '\x02') && ((flag != '\x01' || (*bytes != '\0')))) &&
      ((length < 2 || '\x01' < flag || (*bytes != '\0')))) &&
     (((('\x01' < flag || (mbcsData->utf8Friendly == '\0')) || ((int)(uint)mbcsData->utf8Max < c))
      || ((flag != '\x01' && (*bytes != '\0')))))) {
    return flag == '\0' || mbcsData->omitFromU == '\0';
  }
  return '\0';
}

Assistant:

U_CFUNC UBool
MBCSOkForBaseFromUnicode(const MBCSData *mbcsData,
                         const uint8_t *bytes, int32_t length,
                         UChar32 c, int8_t flag) {
    /*
     * A 1:1 mapping does not fit into the MBCS base table's fromUnicode table under
     * the following conditions:
     *
     * - a |2 SUB mapping for <subchar1> (no base table data structure for them)
     * - a |1 fallback to 0x00 (result value 0, indistinguishable from unmappable entry)
     * - a multi-byte mapping with leading 0x00 bytes (no explicit length field)
     *
     * Some of these tests are redundant with ucm_mappingType().
     */
    if( (flag==2 && length==1) ||
        (flag==1 && bytes[0]==0) || /* testing length==1 would be redundant with the next test */
        (flag<=1 && length>1 && bytes[0]==0)
    ) {
        return FALSE;
    }

    /*
     * Additional restrictions for UTF-8-friendly fromUnicode tables,
     * for code points up to the maximum optimized one:
     *
     * - any mapping to 0x00 (result value 0, indistinguishable from unmappable entry)
     * - any |1 fallback (no roundtrip flags in the optimized table)
     */
    if(mbcsData->utf8Friendly && flag<=1 && c<=mbcsData->utf8Max && (bytes[0]==0 || flag==1)) {
        return FALSE;
    }

    /*
     * If we omit the fromUnicode data, we can only store roundtrips there
     * because only they are recoverable from the toUnicode data.
     * Fallbacks must go into the extension table.
     */
    if(mbcsData->omitFromU && flag!=0) {
        return FALSE;
    }

    /* All other mappings do fit into the base table. */
    return TRUE;
}